

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module **ppsVar1;
  int iVar2;
  sqlite3_vtab *psVar3;
  sqlite3_module *psVar4;
  sqlite3_vtab *psVar5;
  sqlite3_vtab *psVar6;
  Fts5IndexIter *pIndexIter;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  void *__s1;
  long lVar16;
  int iVar17;
  u8 *puVar18;
  long in_FS_OFFSET;
  uint local_50;
  int iOff;
  i64 local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = pCursor->pVtab;
  psVar4 = pCursor[2].pVtab[1].pModule;
  iVar2 = *(int *)&psVar4->xDisconnect;
  lVar16 = (long)iVar2;
  psVar5 = *(sqlite3_vtab **)(*(long *)&pCursor[2].pVtab[1].nRef + 0xa0);
  psVar6 = pCursor[5].pVtab;
  local_3c = (uint)(psVar5 != psVar6) << 2;
  iVar7 = (uint)(psVar5 != psVar6) << 2;
  if (psVar5 != psVar6) {
    iVar7 = 4;
    goto LAB_001d7728;
  }
  pCursor[0xb].pVtab = (sqlite3_vtab *)((long)&(pCursor[0xb].pVtab)->pModule + 1);
  iVar17 = psVar3[2].nRef;
  if (iVar17 != 0) {
    if (iVar17 != 2) goto LAB_001d781f;
    iVar2 = *(int *)((long)&psVar4->xBegin + 4);
    psVar3 = pCursor[4].pVtab;
    do {
      if ((iVar2 != 1) &&
         (iVar7 = sqlite3Fts5PoslistNext64
                            (*(u8 **)&psVar3->nRef,*(int *)&psVar3->zErrMsg,(int *)(pCursor + 0xf),
                             (i64 *)(pCursor + 0xe)), iVar7 == 0)) goto LAB_001d7842;
      pCursor[0xe].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pCursor[0xf].pVtab = 0;
      iVar7 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
      if (iVar7 != 0) break;
      iVar7 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
      if ((iVar2 == 1) || (*(int *)&pCursor[3].pVtab != 0)) goto LAB_001d7728;
    } while (iVar7 == 0);
LAB_001d7ae7:
    *(undefined4 *)&pCursor[3].pVtab = 1;
    goto LAB_001d7728;
  }
  iVar8 = *(int *)((long)&pCursor[8].pVtab + 4);
  uVar11 = (ulong)iVar8;
  iVar8 = iVar8 + 1;
  uVar12 = uVar11;
  if (iVar8 < iVar2) {
    iVar8 = iVar2;
  }
  do {
    if (lVar16 <= (long)(uVar12 + 1)) {
      *(int *)((long)&pCursor[8].pVtab + 4) = iVar8;
      goto LAB_001d781f;
    }
    uVar9 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar9;
    lVar15 = uVar12 * 2;
    uVar12 = uVar12 + 1;
  } while (*(long *)(&(pCursor[10].pVtab)->nRef + lVar15) == 0);
  *(uint *)((long)&pCursor[8].pVtab + 4) = uVar9;
  if ((int)uVar9 < iVar2) goto LAB_001d7830;
LAB_001d781f:
  psVar5 = pCursor[4].pVtab;
  if (*(char *)((long)&psVar5->zErrMsg + 4) == '\0') {
    lVar14 = (ulong)*(ushort *)&(psVar5[4].pModule)->field_0x4 * 0x80;
    lVar15 = *(long *)((long)psVar5 + lVar14 + 200);
    iVar7 = *(int *)((long)psVar5 + lVar14 + 0xd0) + -1;
    puVar18 = (u8 *)(lVar15 + 1);
    if (lVar15 == 0) {
      puVar18 = (u8 *)0x0;
    }
    iVar17 = *(int *)&pCursor[6].pVtab;
    if (-1 < iVar17) {
      iVar8 = iVar17;
      if (iVar7 < iVar17) {
        iVar8 = iVar7;
      }
      iVar8 = memcmp(pCursor[7].pVtab,puVar18,(long)iVar8);
      if ((iVar8 < 0) || (iVar17 < iVar7 && iVar8 == 0)) {
        iVar7 = 0;
        goto LAB_001d7ae7;
      }
    }
    sqlite3Fts5BufferSet(&local_3c,(Fts5Buffer *)(pCursor + 0xc),iVar7,puVar18);
    memset(pCursor[9].pVtab,0,lVar16 * 8);
    memset(pCursor[10].pVtab,0,lVar16 * 8);
    *(undefined4 *)((long)&pCursor[8].pVtab + 4) = 0;
    iVar7 = local_3c;
    if (local_3c == 0) {
      iVar17 = psVar3[2].nRef;
      do {
        iVar7 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xBegin + 4);
        local_48 = 0;
        iOff = 0;
        pIndexIter = (Fts5IndexIter *)pCursor[4].pVtab;
        puVar18 = pIndexIter->pData;
        iVar8 = pIndexIter->nData;
        if (iVar17 == 0) {
          if (iVar7 == 0) {
            uVar9 = 0xffffffff;
            while (iVar7 = sqlite3Fts5PoslistNext64(puVar18,iVar8,&iOff,&local_48), iVar7 == 0) {
              uVar10 = (uint)((ulong)local_48 >> 0x20);
              uVar13 = uVar10 & 0x7fffffff;
              if (uVar9 == uVar13) {
                uVar12 = (ulong)(uVar10 & 0x7fffffff);
              }
              else {
                if (iVar2 <= (int)uVar13) goto LAB_001d7b2e;
                uVar12 = (ulong)(uVar10 & 0x7fffffff);
                ppsVar1 = &(pCursor[10].pVtab)->pModule + uVar12;
                *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
                uVar9 = uVar13;
              }
              ppsVar1 = &(pCursor[9].pVtab)->pModule + uVar12;
              *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
            }
          }
          else {
            if (iVar7 != 2) goto LAB_001d79f7;
            while (iVar7 = sqlite3Fts5PoslistNext64(puVar18,iVar8,&iOff,&local_48), iVar7 == 0) {
              if (lVar16 <= local_48) goto LAB_001d7b2e;
              ppsVar1 = &(pCursor[10].pVtab)->pModule + local_48;
              *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
            }
          }
        }
        else if (iVar17 == 1) {
          if (((iVar7 == 0) && (((ulong)pCursor[8].pVtab & 4) != 0)) && (0 < iVar8)) {
            lVar15 = 0;
            do {
              local_50 = (uint)puVar18[lVar15];
              uVar12 = 1;
              if ((char)puVar18[lVar15] < '\0') {
                uVar9 = sqlite3Fts5GetVarint32(puVar18 + lVar15,&local_50);
                uVar12 = (ulong)uVar9;
              }
              lVar15 = lVar15 + uVar12;
              if (local_50 == 1) {
                if ((char)puVar18[lVar15] < '\0') {
                  uVar9 = sqlite3Fts5GetVarint32(puVar18 + lVar15,&local_50);
                  lVar15 = lVar15 + (ulong)uVar9;
                }
                else {
                  lVar15 = lVar15 + 1;
                }
              }
              else {
                (pCursor[9].pVtab)->pModule =
                     (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
              }
            } while (lVar15 < iVar8);
          }
LAB_001d79f7:
          (pCursor[10].pVtab)->pModule =
               (sqlite3_module *)((long)&(pCursor[10].pVtab)->pModule->iVersion + 1);
        }
        iVar7 = sqlite3Fts5IterNextScan(pIndexIter);
        iVar17 = psVar3[2].nRef;
        if (iVar17 == 2) {
          iVar17 = 2;
          goto LAB_001d7830;
        }
        if (iVar7 != 0) goto LAB_001d7830;
        psVar5 = pCursor[4].pVtab;
        lVar15 = (ulong)*(ushort *)&(psVar5[4].pModule)->field_0x4 * 0x80;
        iVar8 = *(int *)((long)psVar5 + lVar15 + 0xd0);
        lVar15 = *(long *)((long)psVar5 + lVar15 + 200);
        __s1 = (void *)(lVar15 + 1);
        if (lVar15 == 0) {
          __s1 = (void *)0x0;
        }
        uVar9 = iVar8 - 1;
        iVar7 = 0;
        if (((uVar9 != *(uint *)&pCursor[0xd].pVtab) ||
            ((1 < iVar8 &&
             (iVar8 = bcmp(__s1,((Fts5Buffer *)(pCursor + 0xc))->p,(ulong)uVar9), iVar8 != 0)))) ||
           (*(char *)((long)&psVar5->zErrMsg + 4) != '\0')) goto LAB_001d7830;
      } while( true );
    }
    goto LAB_001d7728;
  }
  *(undefined4 *)&pCursor[3].pVtab = 1;
  goto LAB_001d7830;
LAB_001d7b2e:
  iVar17 = 0;
  iVar7 = 0x10b;
LAB_001d7830:
  if (iVar7 == 0) {
    if (iVar17 == 0 && *(int *)&pCursor[3].pVtab == 0) {
      iVar7 = *(int *)((long)&pCursor[8].pVtab + 4);
      lVar15 = (long)iVar7;
      iVar17 = iVar2;
      if (iVar2 < iVar7) {
        iVar17 = iVar7;
      }
      for (; (iVar8 = iVar17, lVar15 < lVar16 &&
             (iVar8 = (int)lVar15, (&(pCursor[10].pVtab)->pModule)[lVar15] == (sqlite3_module *)0x0)
             ); lVar15 = lVar15 + 1) {
        *(int *)((long)&pCursor[8].pVtab + 4) = iVar8 + 1;
      }
      iVar7 = 0x10b;
      if (iVar8 != iVar2) {
        iVar7 = 0;
      }
    }
    else {
LAB_001d7842:
      iVar7 = 0;
    }
  }
LAB_001d7728:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int nCol = pCsr->pFts5->pConfig->nCol;
  int rc;

  rc = sqlite3Fts5StructureTest(pCsr->pFts5->pIndex, pCsr->pStruct);
  if( rc!=SQLITE_OK ) return rc;
  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            /* Do not bother counting the number of instances if the "cnt"
            ** column is not being read (according to colUsed).  */
            if( eDetail==FTS5_DETAIL_FULL && (pCsr->colUsed & 0x04) ){
              while( iPos<nPos ){
                u32 ii;
                fts5FastGetVarint32(pPos, iPos, ii);
                if( ii==1 ){
                  /* New column in the position list */
                  fts5FastGetVarint32(pPos, iPos, ii);
                }else{
                  /* An instance - increment pCsr->aCnt[] */
                  pCsr->aCnt[0]++;
                }
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm))
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}